

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData160 * cfd::core::HashUtil::Hash160(ByteData160 *__return_storage_ptr__,Script *script)

{
  ByteData *__return_storage_ptr___00;
  ByteData local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  Script *local_18;
  Script *script_local;
  
  __return_storage_ptr___00 = &local_48;
  local_18 = script;
  script_local = (Script *)__return_storage_ptr__;
  Script::GetData(__return_storage_ptr___00,script);
  ByteData::GetBytes(&local_30,__return_storage_ptr___00);
  Hash160(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            (&__return_storage_ptr___00->data_);
  ByteData::~ByteData((ByteData *)0x3eb4cc);
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Hash160(const Script &script) {
  return Hash160(script.GetData().GetBytes());
}